

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_command_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  SMTP *pSVar1;
  char *buf;
  size_t len;
  char *line;
  SMTP *smtp;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  smtp._4_4_ = CURLE_OK;
  pSVar1 = (data->req).p.smtp;
  buf = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  if (((((pSVar1->rcpt == (curl_slist *)0x0) || (smtpcode / 100 == 2)) || (smtpcode == 0x229)) ||
      (smtpcode == 1)) &&
     (((pSVar1->rcpt != (curl_slist *)0x0 || (smtpcode / 100 == 2)) || (smtpcode == 1)))) {
    if ((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) == 0) {
      smtp._4_4_ = Curl_client_write(data,1,buf,(data->conn->proto).ftpc.pp.nfinal);
    }
    if (smtpcode != 1) {
      if (pSVar1->rcpt == (curl_slist *)0x0) {
        smtp_state(data,SMTP_STOP);
      }
      else {
        pSVar1->rcpt = pSVar1->rcpt->next;
        if (pSVar1->rcpt == (curl_slist *)0x0) {
          smtp_state(data,SMTP_STOP);
        }
        else {
          smtp._4_4_ = smtp_perform_command(data);
        }
      }
    }
  }
  else {
    Curl_failf(data,"Command failed: %d",(ulong)(uint)smtpcode);
    smtp._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return smtp._4_4_;
}

Assistant:

static CURLcode smtp_state_command_resp(struct Curl_easy *data, int smtpcode,
                                        smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SMTP *smtp = data->req.p.smtp;
  char *line = Curl_dyn_ptr(&data->conn->proto.smtpc.pp.recvbuf);
  size_t len = data->conn->proto.smtpc.pp.nfinal;

  (void)instate; /* no use for this yet */

  if((smtp->rcpt && smtpcode/100 != 2 && smtpcode != 553 && smtpcode != 1) ||
     (!smtp->rcpt && smtpcode/100 != 2 && smtpcode != 1)) {
    failf(data, "Command failed: %d", smtpcode);
    result = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    if(!data->req.no_body)
      result = Curl_client_write(data, CLIENTWRITE_BODY, line, len);

    if(smtpcode != 1) {
      if(smtp->rcpt) {
        smtp->rcpt = smtp->rcpt->next;

        if(smtp->rcpt) {
          /* Send the next command */
          result = smtp_perform_command(data);
        }
        else
          /* End of DO phase */
          smtp_state(data, SMTP_STOP);
      }
      else
        /* End of DO phase */
        smtp_state(data, SMTP_STOP);
    }
  }

  return result;
}